

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O1

uc_err uc_hook_add(uc_engine *uc,uc_hook *hh,int type,void *callback,void *user_data,uint64_t begin,
                  uint64_t end,...)

{
  _Bool _Var1;
  uint uVar2;
  uc_err uVar3;
  int *data;
  GHashTable *pGVar4;
  void *pvVar5;
  list *list;
  ulong uVar6;
  int in_stack_00000010;
  int in_stack_00000018;
  
  if ((uc->init_done == false) && (uVar3 = uc_init_engine(uc), uVar3 != UC_ERR_OK)) {
    return uVar3;
  }
  data = (int *)calloc(1,0x40);
  if (data == (int *)0x0) {
    return UC_ERR_NOMEM;
  }
  *(uint64_t *)(data + 6) = begin;
  *(uint64_t *)(data + 8) = end;
  *data = type;
  *(void **)(data + 10) = callback;
  *(void **)(data + 0xc) = user_data;
  data[2] = 0;
  *(undefined1 *)(data + 5) = 0;
  pGVar4 = g_hash_table_new_full
                     (hooked_regions_hash,hooked_regions_equal,g_free,(GDestroyNotify)0x0);
  *(GHashTable **)(data + 0xe) = pGVar4;
  *hh = (uc_hook)data;
  if ((type & 2U) == 0) {
    if (((uint)type >> 0x10 & 1) == 0) {
      if (0 < type) {
        list = uc->hook;
        uVar6 = 0;
        uVar2 = type;
        do {
          if ((uVar6 < 0x12) && ((uVar2 & 1) != 0)) {
            if (uc->hook_insert == true) {
              pvVar5 = list_insert(list,data);
            }
            else {
              pvVar5 = list_append(list,data);
            }
            if (pvVar5 == (void *)0x0) goto LAB_004d44a7;
            data[2] = data[2] + 1;
            uc->hooks_count[uVar6] = uc->hooks_count[uVar6] + 1;
          }
          uVar6 = uVar6 + 1;
          uVar2 = (uint)type >> ((byte)uVar6 & 0x1f);
          list = list + 1;
        } while (0 < (int)uVar2);
      }
      if (data[2] != 0) {
        return UC_ERR_OK;
      }
      free(data);
    }
    else {
      data[3] = in_stack_00000010;
      data[4] = in_stack_00000018;
      if ((uc->opcode_hook_invalidate != (uc_opcode_hook_validate_t)0x0) &&
         (_Var1 = (*uc->opcode_hook_invalidate)(data[3],data[4]), !_Var1)) goto LAB_004d447d;
      if (uc->hook_insert == true) {
        pvVar5 = list_insert(uc->hook + 0x10,data);
      }
      else {
        pvVar5 = list_append(uc->hook + 0x10,data);
      }
      if (pvVar5 == (void *)0x0) goto LAB_004d44a7;
      data[2] = data[2] + 1;
      uc->hooks_count[0x10] = uc->hooks_count[0x10] + 1;
    }
  }
  else {
    data[1] = in_stack_00000010;
    if ((uc->insn_hook_validate != (uc_insn_hook_validate)0x0) &&
       (_Var1 = (*uc->insn_hook_validate)(data[1]), !_Var1)) {
LAB_004d447d:
      free(data);
      return UC_ERR_HOOK;
    }
    if (uc->hook_insert == true) {
      pvVar5 = list_insert(uc->hook + 1,data);
    }
    else {
      pvVar5 = list_append(uc->hook + 1,data);
    }
    if (pvVar5 == (void *)0x0) {
LAB_004d44a7:
      free(data);
      return UC_ERR_NOMEM;
    }
    data[2] = data[2] + 1;
    uc->hooks_count[1] = uc->hooks_count[1] + 1;
  }
  return UC_ERR_OK;
}

Assistant:

UNICORN_EXPORT
uc_err uc_hook_add(uc_engine *uc, uc_hook *hh, int type, void *callback,
                   void *user_data, uint64_t begin, uint64_t end, ...)
{
    int ret = UC_ERR_OK;
    int i = 0;

    UC_INIT(uc);

    struct hook *hook = calloc(1, sizeof(struct hook));
    if (hook == NULL) {
        return UC_ERR_NOMEM;
    }

    hook->begin = begin;
    hook->end = end;
    hook->type = type;
    hook->callback = callback;
    hook->user_data = user_data;
    hook->refs = 0;
    hook->to_delete = false;
    hook->hooked_regions = g_hash_table_new_full(
        hooked_regions_hash, hooked_regions_equal, g_free, NULL);
    *hh = (uc_hook)hook;

    // UC_HOOK_INSN has an extra argument for instruction ID
    if (type & UC_HOOK_INSN) {
        va_list valist;

        va_start(valist, end);
        hook->insn = va_arg(valist, int);
        va_end(valist);

        if (uc->insn_hook_validate) {
            if (!uc->insn_hook_validate(hook->insn)) {
                free(hook);
                return UC_ERR_HOOK;
            }
        }

        if (uc->hook_insert) {
            if (hook_insert(&uc->hook[UC_HOOK_INSN_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        } else {
            if (hook_append(&uc->hook[UC_HOOK_INSN_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        }

        uc->hooks_count[UC_HOOK_INSN_IDX]++;
        return UC_ERR_OK;
    }

    if (type & UC_HOOK_TCG_OPCODE) {
        va_list valist;

        va_start(valist, end);
        hook->op = va_arg(valist, int);
        hook->op_flags = va_arg(valist, int);
        va_end(valist);

        if (uc->opcode_hook_invalidate) {
            if (!uc->opcode_hook_invalidate(hook->op, hook->op_flags)) {
                free(hook);
                return UC_ERR_HOOK;
            }
        }

        if (uc->hook_insert) {
            if (hook_insert(&uc->hook[UC_HOOK_TCG_OPCODE_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        } else {
            if (hook_append(&uc->hook[UC_HOOK_TCG_OPCODE_IDX], hook) == NULL) {
                free(hook);
                return UC_ERR_NOMEM;
            }
        }

        uc->hooks_count[UC_HOOK_TCG_OPCODE_IDX]++;
        return UC_ERR_OK;
    }

    while ((type >> i) > 0) {
        if ((type >> i) & 1) {
            // TODO: invalid hook error?
            if (i < UC_HOOK_MAX) {
                if (uc->hook_insert) {
                    if (hook_insert(&uc->hook[i], hook) == NULL) {
                        free(hook);
                        return UC_ERR_NOMEM;
                    }
                } else {
                    if (hook_append(&uc->hook[i], hook) == NULL) {
                        free(hook);
                        return UC_ERR_NOMEM;
                    }
                }
                uc->hooks_count[i]++;
            }
        }
        i++;
    }

    // we didn't use the hook
    // TODO: return an error?
    if (hook->refs == 0) {
        free(hook);
    }

    return ret;
}